

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

argagg * __thiscall argagg::wrap_line(argagg *this,string *single_line,size_t wrap_width)

{
  string local_138 [32];
  argagg local_118 [32];
  string local_f8 [32];
  argagg local_d8 [32];
  long local_b8;
  size_type new_position;
  size_t line_start;
  size_t position;
  string result;
  allocator local_69;
  string local_68 [8];
  string indent;
  argagg local_48 [8];
  string line;
  ulong local_28;
  size_type indentation_spaces;
  size_t wrap_width_local;
  string *single_line_local;
  
  local_28 = std::__cxx11::string::find_first_not_of((char *)single_line,0x12b5cc);
  if (local_28 == 0xffffffffffffffff) {
    local_28 = 0;
  }
  lstrip(local_48,single_line);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,local_28,' ',&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::string((string *)&position);
  line_start = 0;
  new_position = 0;
  while( true ) {
    local_b8 = std::__cxx11::string::find_first_of((char *)local_48,0x12b5cc);
    if (local_b8 == -1) break;
    if (new_position + wrap_width < local_b8 + local_28) {
      std::__cxx11::string::substr((ulong)local_f8,(ulong)local_48);
      construct_line(local_d8,(string *)local_68,local_f8);
      std::__cxx11::string::operator+=((string *)&position,(string *)local_d8);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)local_f8);
      new_position = line_start;
    }
    line_start = local_b8 + 1;
  }
  std::__cxx11::string::substr((ulong)local_138,(ulong)local_48);
  construct_line(local_118,(string *)local_68,local_138);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&position);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)&position);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)local_48);
  return this;
}

Assistant:

inline
std::string wrap_line(const std::string& single_line,
                      const std::size_t wrap_width)
{
  auto indentation_spaces = single_line.find_first_not_of(" ");
  if (indentation_spaces == std::string::npos) {
    indentation_spaces = 0;
  }

  const auto line = lstrip(single_line);
  const auto indent = std::string(indentation_spaces, ' ');

  std::string result;

  std::size_t position = 0;
  std::size_t line_start = 0;
  while (true) {
    const auto new_position = line.find_first_of(" ", position);
    if (new_position == std::string::npos) {
      break;
    }

    if (new_position + indentation_spaces > line_start + wrap_width) {
      result += construct_line(
        indent, line.substr(line_start, position - line_start - 1));

      line_start = position;
    }

    position = new_position + 1;
  }

  return result + construct_line(indent, line.substr(line_start));
}